

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v7::detail::bigint::square(bigint *this)

{
  long lVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _func_int **pp_Var6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint *puVar12;
  uint uVar13;
  bool bVar14;
  undefined1 local_e0 [8];
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)local_e0,
             &this->bigits_);
  uVar13 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
  if ((int)uVar13 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                ,0x13c,"negative value");
  }
  uVar4 = (ulong)(uVar13 * 2);
  uVar3 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar3 < uVar4) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar4);
    uVar3 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  }
  if (uVar3 < uVar4) {
    uVar4 = uVar3;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar4;
  if (uVar13 == 0) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar8 = 0;
    uVar3 = 0;
    uVar4 = 0;
    pp_Var6 = n.super_buffer<unsigned_int>._vptr_buffer;
    uVar5 = uVar8;
    do {
      do {
        uVar11 = (ulong)*(uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer + uVar8 * 4) *
                 (ulong)*(uint *)pp_Var6;
        bVar14 = CARRY8(uVar3,uVar11);
        uVar3 = uVar3 + uVar11;
        uVar4 = uVar4 + bVar14;
        bVar14 = uVar8 != 0;
        uVar8 = uVar8 - 1;
        pp_Var6 = (_func_int **)((long)pp_Var6 + 4);
      } while (bVar14);
      puVar2[uVar5] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
      uVar4 = uVar4 >> 0x20;
      uVar8 = uVar5 + 1;
      pp_Var6 = n.super_buffer<unsigned_int>._vptr_buffer;
      uVar5 = uVar8;
    } while (uVar8 != (uVar13 & 0x7fffffff));
  }
  if ((int)uVar13 < (int)(uVar13 * 2)) {
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar5 = (ulong)(uVar13 & 0x7fffffff);
    lVar1 = uVar5 * 4;
    iVar7 = -uVar13;
    uVar9 = 1;
    do {
      if ((int)((int)uVar5 - (uVar13 - 1)) < (int)uVar13) {
        puVar12 = (uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer + (long)(int)uVar9 * 4);
        lVar10 = -1;
        do {
          uVar8 = (ulong)*(uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer +
                                  lVar10 * 4 + lVar1) * (ulong)*puVar12;
          bVar14 = CARRY8(uVar3,uVar8);
          uVar3 = uVar3 + uVar8;
          uVar4 = uVar4 + bVar14;
          lVar10 = lVar10 + -1;
          puVar12 = puVar12 + 1;
        } while (iVar7 != (int)lVar10);
      }
      puVar2[uVar5] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
      uVar4 = uVar4 >> 0x20;
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + 1;
      bVar14 = uVar9 != uVar13;
      uVar9 = uVar9 + 1;
    } while (bVar14);
  }
  n._160_8_ = this;
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  local_e0 = (undefined1  [8])&PTR_grow_002b3c58;
  if (n.super_buffer<unsigned_int>._vptr_buffer !=
      (_func_int **)&n.super_buffer<unsigned_int>.capacity_) {
    operator_delete(n.super_buffer<unsigned_int>._vptr_buffer,
                    n.super_buffer<unsigned_int>.size_ << 2);
  }
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }